

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O0

char * zip_name_normalize(char *name,char *nname,size_t len)

{
  char cVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  size_t sStack_38;
  char c;
  size_t ncpy;
  size_t offn;
  size_t len_local;
  char *nname_local;
  char *name_local;
  
  ncpy = 0;
  sStack_38 = 0;
  if (((name == (char *)0x0) || (nname == (char *)0x0)) || (nname_local = name, len == 0)) {
    name_local = (char *)0x0;
  }
  else {
    while( true ) {
      bVar5 = true;
      if (*nname_local != '/') {
        bVar5 = *nname_local == '\\';
      }
      if (!bVar5) break;
      nname_local = nname_local + 1;
    }
    while( true ) {
      pcVar4 = nname_local + 1;
      cVar1 = *nname_local;
      if (cVar1 == '\0') break;
      nname_local = pcVar4;
      if ((cVar1 == '/') || (cVar1 == '\\')) {
        if ((sStack_38 != 0) && (iVar2 = zip_strchr_match(nname + ncpy,sStack_38,'.'), iVar2 == 0))
        {
          lVar3 = sStack_38 + ncpy;
          ncpy = lVar3 + 1;
          nname[lVar3] = cVar1;
        }
        sStack_38 = 0;
      }
      else {
        nname[ncpy + sStack_38] = cVar1;
        if (cVar1 != '\0') {
          sStack_38 = sStack_38 + 1;
        }
      }
    }
    iVar2 = zip_strchr_match(nname + ncpy,sStack_38,'.');
    name_local = nname;
    if (iVar2 == 0) {
      nname[ncpy + sStack_38] = '\0';
    }
    else {
      nname[ncpy] = '\0';
    }
  }
  return name_local;
}

Assistant:

static char *zip_name_normalize(char *name, char *const nname, size_t len) {
  size_t offn = 0, ncpy = 0;
  char c;

  if (name == NULL || nname == NULL || len <= 0) {
    return NULL;
  }
  // skip trailing '/'
  while (ISSLASH(*name)) {
    name++;
  }

  while ((c = *name++)) {
    if (ISSLASH(c)) {
      if (ncpy > 0 && !zip_strchr_match(&nname[offn], ncpy, '.')) {
        offn += ncpy;
        nname[offn++] = c; // append '/'
      }
      ncpy = 0;
    } else {
      nname[offn + ncpy] = c;
      if (c) {
        ncpy++;
      }
    }
  }

  if (!zip_strchr_match(&nname[offn], ncpy, '.')) {
    nname[offn + ncpy] = '\0';
  } else {
    nname[offn] = '\0';
  }

  return nname;
}